

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.c
# Opt level: O0

int copyprop(int i,int j)

{
  int j_local;
  int i_local;
  
  if (intcode[i].op1.opnd == intcode[j].op2.opnd) {
    j_local = 1;
  }
  else if (intcode[i].op1.opnd == intcode[j].op3.opnd) {
    j_local = 2;
  }
  else {
    j_local = 0;
  }
  return j_local;
}

Assistant:

int	copyprop(int i, int j)
{
    if (intcode[i].op1.opnd == intcode[j].op2.opnd)
        return(1);
    else if (intcode[i].op1.opnd == intcode[j].op3.opnd)
        return(2);
    else
        return(0);
}